

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O2

void __thiscall PEFile::_init(PEFile *this,AbstractByteBuffer *v_buf)

{
  map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
  *this_00;
  int iVar1;
  ResourcesAlbum *this_01;
  mapped_type pEVar2;
  mapped_type *ppEVar3;
  FileHdrWrapper *pFVar4;
  undefined4 extraout_var;
  RichHdrWrapper *this_02;
  OptHdrWrapper *pOVar5;
  undefined4 extraout_var_00;
  SectHdrsWrapper *this_03;
  DataDirEntryWrapper *pDVar6;
  BoundImpDirWrapper *this_04;
  ExportDirWrapper *this_05;
  LdConfigDirWrapper *this_06;
  RelocDirWrapper *this_07;
  ExceptionDirWrapper *this_08;
  ResourceDirWrapper *this_09;
  ExeException *pEVar7;
  long lVar8;
  key_type local_68;
  QString local_60;
  QString local_48;
  
  PECore::wrap(&this->core,v_buf);
  this_01 = (ResourcesAlbum *)operator_new(0xe0);
  ResourcesAlbum::ResourcesAlbum(this_01,(Executable *)this);
  this->album = this_01;
  pEVar2 = (mapped_type)operator_new(0x10);
  DosHdrWrapper::DosHdrWrapper((DosHdrWrapper *)pEVar2,(Executable *)this);
  this->dosHdrWrapper = (DosHdrWrapper *)pEVar2;
  this_00 = &(this->super_MappedExe).super_ExeWrappersContainer.wrappers;
  local_68 = 0;
  ppEVar3 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](this_00,&local_68);
  *ppEVar3 = pEVar2;
  pFVar4 = (FileHdrWrapper *)operator_new(0x20);
  FileHdrWrapper::FileHdrWrapper(pFVar4,this);
  this->fHdr = pFVar4;
  iVar1 = (*(pFVar4->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])(pFVar4);
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pEVar7 = (ExeException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_48,"Cannot parse FileHdr: It is not PE File!");
    ExeException::ExeException(pEVar7,&local_48);
    __cxa_throw(pEVar7,&ExeException::typeinfo,CustomException::~CustomException);
  }
  pFVar4 = this->fHdr;
  local_68 = 2;
  ppEVar3 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](this_00,&local_68);
  *ppEVar3 = (mapped_type)pFVar4;
  this_02 = (RichHdrWrapper *)operator_new(0x30);
  RichHdrWrapper::RichHdrWrapper(this_02,this);
  local_68 = 1;
  ppEVar3 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](this_00,&local_68);
  *ppEVar3 = (mapped_type)this_02;
  pOVar5 = (OptHdrWrapper *)operator_new(0x40);
  OptHdrWrapper::OptHdrWrapper(pOVar5,this);
  this->optHdr = pOVar5;
  iVar1 = (*(pOVar5->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])(pOVar5);
  if (CONCAT44(extraout_var_00,iVar1) != 0) {
    pOVar5 = this->optHdr;
    local_68 = 3;
    ppEVar3 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](this_00,&local_68);
    *ppEVar3 = (mapped_type)pOVar5;
    this_03 = (SectHdrsWrapper *)operator_new(0xb0);
    SectHdrsWrapper::SectHdrsWrapper(this_03,this);
    this->sects = this_03;
    local_68 = 5;
    ppEVar3 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](this_00,&local_68);
    *ppEVar3 = (mapped_type)this_03;
    pEVar2 = (mapped_type)operator_new(0x18);
    DataDirWrapper::DataDirWrapper((DataDirWrapper *)pEVar2,this);
    local_68 = 4;
    ppEVar3 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](this_00,&local_68);
    *ppEVar3 = pEVar2;
    pDVar6 = (DataDirEntryWrapper *)operator_new(0xa8);
    ImportDirWrapper::ImportDirWrapper((ImportDirWrapper *)pDVar6,this);
    this->dataDirEntries[1] = pDVar6;
    pDVar6 = (DataDirEntryWrapper *)operator_new(0xa8);
    DelayImpDirWrapper::DelayImpDirWrapper((DelayImpDirWrapper *)pDVar6,this);
    this->dataDirEntries[0xd] = pDVar6;
    this_04 = (BoundImpDirWrapper *)operator_new(0x58);
    BoundImpDirWrapper::BoundImpDirWrapper(this_04,this);
    this->dataDirEntries[0xb] = (DataDirEntryWrapper *)this_04;
    pDVar6 = (DataDirEntryWrapper *)operator_new(0x50);
    DebugDirWrapper::DebugDirWrapper((DebugDirWrapper *)pDVar6,this);
    this->dataDirEntries[6] = pDVar6;
    this_05 = (ExportDirWrapper *)operator_new(0x80);
    ExportDirWrapper::ExportDirWrapper(this_05,this);
    this->dataDirEntries[0] = (DataDirEntryWrapper *)this_05;
    pDVar6 = (DataDirEntryWrapper *)operator_new(0x50);
    SecurityDirWrapper::SecurityDirWrapper((SecurityDirWrapper *)pDVar6,this);
    this->dataDirEntries[4] = pDVar6;
    pDVar6 = (DataDirEntryWrapper *)operator_new(0x50);
    TlsDirWrapper::TlsDirWrapper((TlsDirWrapper *)pDVar6,this);
    this->dataDirEntries[9] = pDVar6;
    this_06 = (LdConfigDirWrapper *)operator_new(0x80);
    LdConfigDirWrapper::LdConfigDirWrapper(this_06,this);
    this->dataDirEntries[10] = (DataDirEntryWrapper *)this_06;
    this_07 = (RelocDirWrapper *)operator_new(0x58);
    RelocDirWrapper::RelocDirWrapper(this_07,this);
    this->dataDirEntries[5] = (DataDirEntryWrapper *)this_07;
    this_08 = (ExceptionDirWrapper *)operator_new(0x58);
    ExceptionDirWrapper::ExceptionDirWrapper(this_08,this);
    this->dataDirEntries[3] = (DataDirEntryWrapper *)this_08;
    this_09 = (ResourceDirWrapper *)operator_new(0x70);
    ResourceDirWrapper::ResourceDirWrapper(this_09,this,this->album,0,0,-1);
    this->dataDirEntries[2] = (DataDirEntryWrapper *)this_09;
    pDVar6 = (DataDirEntryWrapper *)operator_new(0x50);
    ClrDirWrapper::ClrDirWrapper((ClrDirWrapper *)pDVar6,this);
    this->dataDirEntries[0xe] = pDVar6;
    for (lVar8 = 0; lVar8 != 0xf; lVar8 = lVar8 + 1) {
      pDVar6 = this->dataDirEntries[lVar8];
      local_68 = lVar8 + 6;
      ppEVar3 = std::
                map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
                ::operator[](this_00,&local_68);
      *ppEVar3 = (mapped_type)pDVar6;
    }
    if (this->album != (ResourcesAlbum *)0x0) {
      ResourcesAlbum::wrapLeafsContent(this->album);
    }
    return;
  }
  pEVar7 = (ExeException *)__cxa_allocate_exception(0x48);
  QString::QString(&local_60,"Cannot parse OptionalHeader: It is not PE File!");
  ExeException::ExeException(pEVar7,&local_60);
  __cxa_throw(pEVar7,&ExeException::typeinfo,CustomException::~CustomException);
}

Assistant:

void PEFile::_init(AbstractByteBuffer *v_buf)
{
    // wrap the core:
    core.wrap(v_buf);

    album = new ResourcesAlbum(this);
    
    //generate wrappers:
    this->dosHdrWrapper = new DosHdrWrapper(this);
    this->wrappers[WR_DOS_HDR] = this->dosHdrWrapper;

    this->fHdr = new FileHdrWrapper(this);
    if (fHdr->getPtr() == NULL) throw ExeException("Cannot parse FileHdr: It is not PE File!");
    this->wrappers[WR_FILE_HDR] = fHdr;
    this->wrappers[WR_RICH_HDR] = new RichHdrWrapper(this);

    this->optHdr = new OptHdrWrapper(this);
    if (optHdr->getPtr() == NULL) throw ExeException("Cannot parse OptionalHeader: It is not PE File!");
    this->wrappers[WR_OPTIONAL_HDR] = optHdr;

    this->sects = new SectHdrsWrapper(this);
    this->wrappers[WR_SECTIONS] = sects;

    this->wrappers[WR_DATADIR] = new DataDirWrapper(this);
    dataDirEntries[pe::DIR_IMPORT] = new ImportDirWrapper(this);
    dataDirEntries[pe::DIR_DELAY_IMPORT] = new DelayImpDirWrapper(this);
    dataDirEntries[pe::DIR_BOUND_IMPORT] = new BoundImpDirWrapper(this);
    dataDirEntries[pe::DIR_DEBUG] = new DebugDirWrapper(this);
    dataDirEntries[pe::DIR_EXPORT] = new ExportDirWrapper(this);
    dataDirEntries[pe::DIR_SECURITY] = new SecurityDirWrapper(this);
    dataDirEntries[pe::DIR_TLS] = new TlsDirWrapper(this);
    dataDirEntries[pe::DIR_LOAD_CONFIG] = new LdConfigDirWrapper(this);
    dataDirEntries[pe::DIR_BASERELOC] = new RelocDirWrapper(this);
    dataDirEntries[pe::DIR_EXCEPTION] = new ExceptionDirWrapper(this);
    dataDirEntries[pe::DIR_RESOURCE] = new ResourceDirWrapper(this, album);
    dataDirEntries[pe::DIR_COM_DESCRIPTOR] = new ClrDirWrapper(this); 
 
    for (int i = 0; i < pe::DIR_ENTRIES_COUNT; i++) {
        this->wrappers[WR_DIR_ENTRY + i] = dataDirEntries[i];
    }
    if (this->album) {
        this->album->wrapLeafsContent();
    }
}